

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float32_le_quiet_s390x(float32 a,float32 b,float_status *status)

{
  bool bVar1;
  uint32_t a_1;
  uint32_t a_2;
  
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    a = a & 0x80000000;
  }
  if ((status->flush_inputs_to_zero != '\0') && ((b & 0x7fffff) != 0 && (b & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    b = b & 0x80000000;
  }
  if (((~a & 0x7f800000) == 0 && (a & 0x7fffff) != 0) ||
     ((b & 0x7fffff) != 0 && (~b & 0x7f800000) == 0)) {
    if (((a & 0x7fc00000) == 0x7f800000 && (a & 0x3fffff) != 0) ||
       ((b & 0x3fffff) != 0 && (b & 0x7fc00000) == 0x7f800000)) {
      status->float_exception_flags = status->float_exception_flags | 1;
    }
    bVar1 = false;
  }
  else if ((int)(b ^ a) < 0) {
    bVar1 = ((b | a) & 0x7fffffff) == 0 || (int)a < 0;
  }
  else {
    bVar1 = (int)a < 0 != a < b || a == b;
  }
  return (int)bVar1;
}

Assistant:

float32 float32_squash_input_denormal(float32 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float32_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float32_set_sign(float32_zero, p.sign);
        }
    }
    return a;
}